

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

void restore_food(memfile *mf,level *lev)

{
  byte bVar1;
  uint uVar2;
  int32_t iVar3;
  undefined8 local_30;
  undefined8 local_28;
  uint vflags;
  uint oid;
  level *lev_local;
  memfile *mf_local;
  
  uVar2 = mread32(mf);
  if (uVar2 == 0) {
    local_28 = (obj *)0x0;
  }
  else {
    local_28 = find_oid(lev,uVar2);
  }
  victual.piece = local_28;
  victual.usedtime = mread32(mf);
  victual.reqtime = mread32(mf);
  victual.nmod = mread32(mf);
  iVar3 = mread32(mf);
  bVar1 = (byte)((uint)iVar3 >> 0x18);
  victual._20_1_ =
       victual._20_1_ & 0xf0 | bVar1 >> 7 | (bVar1 >> 6 & 1) << 1 | (bVar1 >> 5 & 1) << 2 |
       (bVar1 >> 4 & 1) << 3;
  uVar2 = mread32(mf);
  if (uVar2 == 0) {
    local_30 = (obj *)0x0;
  }
  else {
    local_30 = find_oid(lev,uVar2);
  }
  tin.tin = local_30;
  tin.usedtime = mread32(mf);
  tin.reqtime = mread32(mf);
  return;
}

Assistant:

void restore_food(struct memfile *mf, struct level *lev)
{
    unsigned int oid, vflags;
    oid = mread32(mf);
    victual.piece = oid ? find_oid(lev, oid) : NULL;
    victual.usedtime = mread32(mf);
    victual.reqtime = mread32(mf);
    victual.nmod = mread32(mf);

    vflags = mread32(mf);
    victual.canchoke = (vflags >> 31) & 1;
    victual.fullwarn = (vflags >> 30) & 1;
    victual.eating   = (vflags >> 29) & 1;
    victual.doreset  = (vflags >> 28) & 1;

    oid = mread32(mf);
    tin.tin = oid ? find_oid(lev, oid) : NULL;
    tin.usedtime = mread32(mf);
    tin.reqtime = mread32(mf);
}